

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

IStream * Json::operator>>(IStream *sin,Value *root)

{
  bool bVar1;
  CharReaderBuilder *in_RDI;
  bool ok;
  String errs;
  CharReaderBuilder b;
  String *in_stack_00000158;
  Value *in_stack_00000160;
  IStream *in_stack_00000168;
  Factory *in_stack_00000170;
  CharReaderBuilder *in_stack_ffffffffffffff80;
  String *msg;
  String local_60 [2];
  CharReaderBuilder *local_8;
  
  local_8 = in_RDI;
  CharReaderBuilder::CharReaderBuilder(in_stack_ffffffffffffff80);
  msg = local_60;
  std::__cxx11::string::string((string *)msg);
  bVar1 = parseFromStream(in_stack_00000170,in_stack_00000168,in_stack_00000160,in_stack_00000158);
  if (!bVar1) {
    throwRuntimeError(msg);
  }
  std::__cxx11::string::~string((string *)local_60);
  CharReaderBuilder::~CharReaderBuilder(local_8);
  return (IStream *)local_8;
}

Assistant:

IStream& operator>>(IStream& sin, Value& root) {
  CharReaderBuilder b;
  String errs;
  bool ok = parseFromStream(b, sin, &root, &errs);
  if (!ok) {
    throwRuntimeError(errs);
  }
  return sin;
}